

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

uchar * nvpair_pack_bool_array(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  size_t sVar1;
  char *__assertion;
  
  if (nvp == (nvpair_t *)0x0) {
    __assertion = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type != 8) {
        __assert_fail("nvp->nvp_type == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x200,
                      "unsigned char *nvpair_pack_bool_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      if (nvp->nvp_datasize <= *leftp) {
        memcpy(ptr,(void *)nvp->nvp_data,nvp->nvp_datasize);
        sVar1 = nvp->nvp_datasize;
        *leftp = *leftp - sVar1;
        return ptr + sVar1;
      }
      __assert_fail("*leftp >= nvp->nvp_datasize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x201,
                    "unsigned char *nvpair_pack_bool_array(const nvpair_t *, unsigned char *, size_t *)"
                   );
    }
    __assertion = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x1ff,
                "unsigned char *nvpair_pack_bool_array(const nvpair_t *, unsigned char *, size_t *)"
               );
}

Assistant:

unsigned char *
nvpair_pack_bool_array(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_BOOL_ARRAY);
	PJDLOG_ASSERT(*leftp >= nvp->nvp_datasize);

	memcpy(ptr, (const void *)(intptr_t)nvp->nvp_data, nvp->nvp_datasize);
	ptr += nvp->nvp_datasize;
	*leftp -= nvp->nvp_datasize;

	return (ptr);
}